

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcGetIntegerv(void)

{
  ALCenum param_00;
  ALCsizei size_00;
  int32 iVar1;
  ALCdevice *device_00;
  ALCint *origvalues_00;
  ALCint *local_260;
  int local_254;
  ALCboolean isbool;
  ALCsizei i;
  ALCint *values;
  ALCint *origvalues;
  ALCsizei size;
  ALCenum param;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    param_00 = IO_ALCENUM();
    size_00 = IO_ALCSIZEI();
    origvalues_00 = (ALCint *)IO_PTR();
    if (origvalues_00 == (ALCint *)0x0) {
      local_260 = (ALCint *)0x0;
    }
    else {
      local_260 = (ALCint *)get_ioblob((long)size_00 << 2);
      for (local_254 = 0; local_254 < size_00; local_254 = local_254 + 1) {
        iVar1 = IO_INT32();
        local_260[local_254] = iVar1;
      }
    }
    if (io_failure == 0) {
      visit_alcGetIntegerv
                ((CallerInfo *)&device,device_00,param_00,size_00,origvalues_00,param_00 == 0x313,
                 local_260);
    }
  }
  return;
}

Assistant:

static void decode_alcGetIntegerv(void)
{
    IO_START(alcGetIntegerv);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    const ALCenum param = IO_ALCENUM();
    const ALCsizei size = IO_ALCSIZEI();
    ALCint *origvalues = (ALint *) IO_PTR();
    ALCint *values = (ALCint *) (origvalues ? get_ioblob(size * sizeof (ALCint)) : NULL);
    ALCsizei i;
    ALCboolean isbool = ALC_FALSE;

    if (origvalues) {
        for (i = 0; i < size; i++) {
            values[i] = IO_INT32();
        }
    }

    switch (param) {
        case ALC_CONNECTED: isbool = ALC_TRUE; break;
        default: break;
    }

    if (!io_failure) visit_alcGetIntegerv(&callerinfo, device, param, size, origvalues, isbool, values);

    IO_END();
}